

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O3

int gimage::getViewImageName(string *image,char *name,char *spath,bool verbose)

{
  pointer pcVar1;
  void *pvVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined1 *puVar5;
  int iVar6;
  ImageIO *pIVar7;
  long *plVar8;
  undefined8 uVar9;
  ostream *poVar10;
  ulong uVar11;
  undefined8 *puVar12;
  iterator iVar13;
  _Base_ptr p_Var14;
  long lVar15;
  _Base_ptr p_Var16;
  undefined7 in_register_00000009;
  size_type *psVar17;
  ulong *puVar18;
  ulong *puVar19;
  char cVar20;
  long lVar21;
  ulong uVar22;
  pointer pbVar23;
  long lVar24;
  ulong *puVar25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  long w;
  int d;
  int dd;
  long h;
  string s;
  string depthname;
  long dh;
  int dd_1;
  long dw;
  long h_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flist;
  ulong local_2b0;
  allocator_type local_2a1;
  ulong local_2a0;
  ulong *local_298;
  string *local_290;
  undefined4 local_284;
  char *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260;
  undefined4 local_23c;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  ulong local_218;
  undefined8 local_210;
  key_type local_208;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [32];
  _Base_ptr local_1a8;
  size_t local_1a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  long local_168;
  int local_15c;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  string local_138;
  undefined1 local_118 [24];
  undefined2 uStack_100;
  undefined6 uStack_fe;
  _Rb_tree_node_base *local_f8;
  size_t local_f0;
  _Rb_tree_node_base local_e8;
  _Rb_tree_node_base local_c8;
  _Rb_tree_node_base local_a8;
  _Rb_tree_node_base local_88;
  _Rb_tree_node_base local_68;
  _Rb_tree_color local_48;
  undefined1 local_44;
  _Base_ptr local_38;
  
  local_284 = (undefined4)CONCAT71(in_register_00000009,verbose);
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290 = image;
  std::__cxx11::string::string((string *)local_118,name,(allocator *)&local_198);
  gutil::split(&local_278,(string *)local_118,',',true);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_);
  }
  local_290->_M_string_length = 0;
  *(local_290->_M_dataplus)._M_p = '\0';
  local_280 = spath;
  if ((ulong)((long)local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_278.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    local_2b0 = 0;
  }
  else {
    uVar22 = 1;
    local_2b0 = 0;
    lVar21 = 0x20;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((long)&((local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar21,0,(char *)0x2);
      if (iVar6 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_118,
                   (long)&((local_278.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar21);
        std::__cxx11::string::operator=((string *)local_290,(string *)local_118);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_);
        }
        local_2b0 = 1;
      }
      uVar22 = uVar22 + 1;
      lVar21 = lVar21 + 0x20;
    } while (uVar22 < (ulong)((long)local_278.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_278.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_290->_M_string_length == 0) {
    local_198._M_impl._0_8_ = &local_198._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar1 = ((local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar1,
               pcVar1 + (local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    lVar21 = std::__cxx11::string::find_last_of((char *)&local_198,0x1630cc,0xffffffffffffffff);
    if (8 < (ulong)(CONCAT44(local_198._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_198._M_impl.super__Rb_tree_header._M_header._M_color) -
                   (lVar21 + 1))) {
      std::__cxx11::string::substr((ulong)local_118,(ulong)&local_198);
      iVar6 = std::__cxx11::string::compare(local_118);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      if (iVar6 == 0) {
        pIVar7 = getImageIO();
        ImageIO::loadHeader(pIVar7,(char *)local_198._M_impl._0_8_,(long *)&local_158,&local_168,
                            (int *)&local_210);
        _uStack_100 = local_118 + 8;
        local_118._8_8_ = (ulong)(uint)local_118._12_4_ << 0x20;
        local_118._16_8_ = 0;
        local_f0 = 0;
        local_f8 = (_Rb_tree_node_base *)_uStack_100;
        std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_198);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
        psVar17 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_208.field_2._M_allocated_capacity = *psVar17;
          local_208.field_2._8_8_ = plVar8[3];
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar17;
          local_208._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_208._M_string_length = plVar8[1];
        *plVar8 = (long)psVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_208,local_208._M_string_length,0,'\x01');
        psVar17 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_260.field_2._M_allocated_capacity = *psVar17;
          local_260.field_2._8_8_ = plVar8[3];
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        }
        else {
          local_260.field_2._M_allocated_capacity = *psVar17;
          local_260._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_260._M_string_length = plVar8[1];
        *plVar8 = (long)psVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_260);
        psVar17 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar17) {
          local_1c8._16_8_ = *psVar17;
          local_1c8._24_8_ = plVar8[3];
          local_1c8._0_8_ = local_1c8 + 0x10;
        }
        else {
          local_1c8._16_8_ = *psVar17;
          local_1c8._0_8_ = (size_type *)*plVar8;
        }
        local_1c8._8_8_ = plVar8[1];
        *plVar8 = (long)psVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
        gutil::getFileList((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_118,(string *)local_1c8,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if ((_Rb_tree_node_base *)_uStack_100 != (_Rb_tree_node_base *)(local_118 + 8)) {
          uVar9 = _uStack_100;
          do {
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,*(long *)(uVar9 + 0x20),
                       (long)&((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent->_M_color +
                       *(long *)(uVar9 + 0x20));
            pIVar7 = getImageIO();
            ImageIO::loadHeader(pIVar7,(char *)local_1c8._0_8_,(long *)&local_260,(long *)&local_208
                                ,(int *)&local_238);
            uVar22 = (long)(local_260._M_dataplus._M_p + (long)local_158 + -1) / (long)local_158;
            lVar21 = (long)(int)uVar22;
            if (((ulong *)((long)(local_260._M_dataplus._M_p + lVar21 + -1) / lVar21) == local_158)
               && ((long)(local_208._M_dataplus._M_p + lVar21 + -1) / lVar21 == local_168)) {
              if ((char)local_284 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Found suitable image: ",0x16);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_1c8._0_8_,local_1c8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
              }
              if ((int)local_210 == 1) {
                std::__cxx11::string::_M_assign((string *)local_290);
                local_210._0_4_ = (int)local_238;
                local_2b0 = uVar22;
              }
            }
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_);
            }
            uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
          } while ((_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)(local_118 + 8));
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_118);
      }
    }
    if ((_Base_ptr *)local_198._M_impl._0_8_ !=
        &local_198._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_198._M_impl._0_8_);
    }
    if (local_290->_M_string_length == 0) {
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      pcVar1 = ((local_278.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,pcVar1,
                 pcVar1 + (local_278.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      uVar22 = std::__cxx11::string::rfind((char)&local_260,0x3a);
      if (uVar22 == 0xffffffffffffffff) {
        local_23c = 0;
      }
      else {
        uVar9 = std::__cxx11::string::compare((ulong)&local_260,uVar22,(char *)0x2);
        local_23c = (undefined4)CONCAT71((int7)((ulong)uVar9 >> 8),(int)uVar9 != 0);
      }
      pIVar7 = getImageIO();
      ImageIO::loadHeader(pIVar7,local_260._M_dataplus._M_p,&local_168,&local_210,&local_15c);
      pbVar4 = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_15c = 0;
      pbVar23 = local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_278.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pcVar1 = (pbVar23->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &pbVar23->field_2) {
            operator_delete(pcVar1);
          }
          pbVar23 = pbVar23 + 1;
        } while (pbVar23 != pbVar4);
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
      }
      getPrefixAlternatives(&local_278,&local_260,local_280);
      if ((local_278.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_278.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) && (local_290->_M_string_length == 0)) {
        local_280 = (char *)CONCAT44(local_280._4_4_,0xffffffff);
        local_218 = 0;
        do {
          pbVar3 = local_278.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_198._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_198._M_impl.super__Rb_tree_header._M_header;
          local_198._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_198._M_impl.super__Rb_tree_header._M_header._M_right =
               local_198._M_impl.super__Rb_tree_header._M_header._M_left;
          local_118._0_8_ = local_118 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
          gutil::getFileList((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_198,pbVar3 + local_218,(string *)local_118);
          if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
            operator_delete((void *)local_118._0_8_);
          }
          local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffff00000000;
          local_1c8._16_8_ = 0;
          local_1c8._24_8_ = local_1c8 + 8;
          local_1a0 = 0;
          local_1a8 = (_Base_ptr)local_1c8._24_8_;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_1c8,&local_260);
          p_Var14 = local_198._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            if ((_Rb_tree_header *)p_Var14 == &local_198._M_impl.super__Rb_tree_header) break;
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            if ((char)local_23c != '\0') {
              std::__cxx11::string::find_last_of((char *)&local_208,0x1630cc,0xffffffffffffffff);
              cVar20 = (char)&local_208;
              uVar22 = std::__cxx11::string::find(cVar20,0x5f);
              if ((uVar22 != 0xffffffffffffffff) &&
                 (uVar11 = std::__cxx11::string::rfind(cVar20,0x5f), uVar22 < uVar11)) {
                std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_208);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
                local_238 = &local_228;
                puVar19 = (ulong *)(plVar8 + 2);
                if ((ulong *)*plVar8 == puVar19) {
                  local_228 = *puVar19;
                  lStack_220 = plVar8[3];
                }
                else {
                  local_228 = *puVar19;
                  local_238 = (ulong *)*plVar8;
                }
                local_230 = plVar8[1];
                *plVar8 = (long)puVar19;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_208);
                uVar22 = 0xf;
                if (local_238 != &local_228) {
                  uVar22 = local_228;
                }
                if (uVar22 < (ulong)(local_150 + local_230)) {
                  uVar22 = 0xf;
                  if (local_158 != local_148) {
                    uVar22 = local_148[0];
                  }
                  if (uVar22 < (ulong)(local_150 + local_230)) goto LAB_00141b22;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_158,0,(char *)0x0,(ulong)local_238);
                }
                else {
LAB_00141b22:
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_158);
                }
                psVar17 = puVar12 + 2;
                if ((size_type *)*puVar12 == psVar17) {
                  local_118._16_8_ = *psVar17;
                  _uStack_100 = puVar12[3];
                  local_118._0_8_ = local_118 + 0x10;
                }
                else {
                  local_118._16_8_ = *psVar17;
                  local_118._0_8_ = (size_type *)*puVar12;
                }
                local_118._8_8_ = puVar12[1];
                *puVar12 = psVar17;
                puVar12[1] = 0;
                *(char *)psVar17 = '\0';
                std::__cxx11::string::operator=((string *)&local_208,(string *)local_118);
                if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                  operator_delete((void *)local_118._0_8_);
                }
                if (local_158 != local_148) {
                  operator_delete(local_158);
                }
                if (local_238 != &local_228) {
                  operator_delete(local_238);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                }
              }
            }
            iVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1c8,&local_208);
            if (((iVar13._M_node == (_Base_ptr)(local_1c8 + 8)) &&
                (iVar6 = std::__cxx11::string::compare
                                   ((ulong)&local_208,local_208._M_string_length - 4,(char *)0x4),
                iVar6 != 0)) &&
               (iVar6 = std::__cxx11::string::compare
                                  ((ulong)&local_208,local_208._M_string_length - 4,(char *)0x4),
               iVar6 != 0)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_1c8,&local_208);
              pIVar7 = getImageIO();
              ImageIO::loadHeader(pIVar7,local_208._M_dataplus._M_p,(long *)&local_238,
                                  (long *)&local_138,(int *)&local_158);
              uVar22 = ((long)local_238 + local_168 + -1) / local_168;
              lVar21 = (long)(int)uVar22;
              if ((((long)local_238 + lVar21 + -1) / lVar21 == local_168) &&
                 ((long)(local_138._M_dataplus._M_p + lVar21 + -1) / lVar21 ==
                  CONCAT44(local_210._4_4_,(int)local_210))) {
                if ((char)local_284 != '\0') {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Found suitable image: ",0x16);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_208._M_dataplus._M_p,
                                       local_208._M_string_length);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                }
                std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_208);
                lVar21 = local_1e0;
                puVar5 = local_1e8;
                local_2a0 = uVar22;
                if (local_1e0 != 0) {
                  lVar24 = 0;
                  do {
                    iVar6 = tolower((int)(char)puVar5[lVar24]);
                    puVar5[lVar24] = (char)iVar6;
                    lVar24 = lVar24 + 1;
                  } while (lVar21 != lVar24);
                }
                if (((anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                     whitelist_abi_cxx11_ == '\0') &&
                   (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                                 getTextureNameRating(std::__cxx11::string)::
                                                 whitelist_abi_cxx11_), iVar6 != 0)) {
                  local_118._0_8_ = local_118 + 0x10;
                  local_118._16_8_ = 0x7469736e65746e69;
                  local_118._8_8_ = 9;
                  uStack_100 = 0x79;
                  local_f8 = &local_e8;
                  local_e8._M_color._2_1_ = 0x67;
                  local_e8._M_color._0_2_ = 0x6d69;
                  local_f0 = 3;
                  local_e8._M_color._3_1_ = _S_red >> 0x18;
                  local_e8._M_left = &local_c8;
                  local_c8._4_1_ = 0x65;
                  local_c8._M_color = 0x67616d69;
                  local_e8._M_right = (_Base_ptr)0x5;
                  local_c8._5_1_ = 0;
                  local_c8._M_left = &local_a8;
                  local_a8._M_color = 0x6f6e6f6d;
                  local_c8._M_right = (_Base_ptr)0x4;
                  local_a8._4_1_ = 0;
                  local_a8._M_left = &local_88;
                  local_88._4_1_ = 0x72;
                  local_88._M_color = 0x6f6c6f63;
                  local_a8._M_right = (_Base_ptr)0x5;
                  local_88._5_1_ = 0;
                  local_88._M_left = &local_68;
                  local_68._M_color._2_1_ = 0x62;
                  local_68._M_color._0_2_ = 0x6772;
                  local_88._M_right = (_Base_ptr)0x3;
                  local_68._M_color._3_1_ = _S_red >> 0x18;
                  local_68._M_left = (_Base_ptr)&local_48;
                  local_48 = 0x7466656c;
                  local_68._M_right = (_Base_ptr)0x4;
                  local_44 = 0;
                  __l._M_len = 7;
                  __l._M_array = (iterator)local_118;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                               whitelist_abi_cxx11_,__l,&local_2a1);
                  lVar21 = 0;
                  do {
                    pvVar2 = *(void **)((long)&local_68._M_left + lVar21);
                    if ((void *)((long)&local_48 + lVar21) != pvVar2) {
                      operator_delete(pvVar2);
                    }
                    lVar21 = lVar21 + -0x20;
                  } while (lVar21 != -0xe0);
                  __cxa_atexit(std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::~vector,
                               &(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                                whitelist_abi_cxx11_,&__dso_handle);
                  __cxa_guard_release(&(anonymous_namespace)::
                                       getTextureNameRating(std::__cxx11::string)::
                                       whitelist_abi_cxx11_);
                }
                if (((anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                     blacklist_abi_cxx11_ == '\0') &&
                   (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                                 getTextureNameRating(std::__cxx11::string)::
                                                 blacklist_abi_cxx11_), iVar6 != 0)) {
                  local_118._0_8_ = local_118 + 0x10;
                  local_118._8_8_ = 5;
                  local_118._16_6_ = 0x7468676972;
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)local_118;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                               blacklist_abi_cxx11_,__l_00,&local_2a1);
                  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                    operator_delete((void *)local_118._0_8_);
                  }
                  __cxa_atexit(std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::~vector,
                               &(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                                blacklist_abi_cxx11_,&__dso_handle);
                  __cxa_guard_release(&(anonymous_namespace)::
                                       getTextureNameRating(std::__cxx11::string)::
                                       blacklist_abi_cxx11_);
                }
                local_298 = DAT_00178700;
                lVar21 = (long)DAT_00178700 -
                         (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                               blacklist_abi_cxx11_;
                puVar19 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                          blacklist_abi_cxx11_;
                if (0 < lVar21 >> 7) {
                  lVar24 = (lVar21 >> 7) + 1;
                  puVar25 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                            blacklist_abi_cxx11_ + 8;
                  do {
                    puVar19 = puVar25;
                    lVar15 = std::__cxx11::string::find((char *)&local_1e8,puVar19[-8],0);
                    if (lVar15 != -1) {
                      puVar19 = puVar19 + -8;
                      uVar22 = local_2a0;
                      puVar25 = local_298;
                      goto LAB_00141fc9;
                    }
                    lVar15 = std::__cxx11::string::find((char *)&local_1e8,puVar19[-4],0);
                    if (lVar15 != -1) {
                      puVar19 = puVar19 + -4;
                      uVar22 = local_2a0;
                      puVar25 = local_298;
                      goto LAB_00141fc9;
                    }
                    lVar15 = std::__cxx11::string::find((char *)&local_1e8,*puVar19,0);
                    uVar22 = local_2a0;
                    puVar25 = local_298;
                    if (lVar15 != -1) goto LAB_00141fc9;
                    lVar15 = std::__cxx11::string::find((char *)&local_1e8,puVar19[4],0);
                    if (lVar15 != -1) {
                      puVar19 = puVar19 + 4;
                      uVar22 = local_2a0;
                      puVar25 = local_298;
                      goto LAB_00141fc9;
                    }
                    lVar24 = lVar24 + -1;
                    lVar21 = lVar21 + -0x80;
                    puVar25 = puVar19 + 0x10;
                  } while (1 < lVar24);
                  puVar19 = puVar19 + 8;
                }
                uVar22 = local_2a0;
                lVar21 = lVar21 >> 5;
                puVar25 = local_298;
                if (lVar21 == 1) {
LAB_00141faa:
                  lVar21 = std::__cxx11::string::find((char *)&local_1e8,*puVar19,0);
                  if (lVar21 == -1) {
                    puVar19 = puVar25;
                  }
LAB_00141fc9:
                  lVar21 = 0;
                  if (puVar19 == puVar25) goto LAB_00141fd4;
                }
                else {
                  if (lVar21 == 2) {
LAB_00141f7a:
                    puVar25 = local_298;
                    lVar21 = std::__cxx11::string::find((char *)&local_1e8,*puVar19,0);
                    if (lVar21 == -1) {
                      puVar19 = puVar19 + 4;
                      goto LAB_00141faa;
                    }
                    goto LAB_00141fc9;
                  }
                  if (lVar21 == 3) {
                    lVar21 = std::__cxx11::string::find((char *)&local_1e8,*puVar19,0);
                    puVar25 = local_298;
                    if (lVar21 == -1) {
                      puVar19 = puVar19 + 4;
                      goto LAB_00141f7a;
                    }
                    goto LAB_00141fc9;
                  }
LAB_00141fd4:
                  puVar19 = DAT_001786e0;
                  p_Var16 = (_Base_ptr)
                            ((long)DAT_001786e0 -
                            (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)
                                  ::whitelist_abi_cxx11_);
                  puVar25 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                            whitelist_abi_cxx11_;
                  if (0 < (long)p_Var16 >> 7) {
                    local_298 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                                whitelist_abi_cxx11_;
                    lVar24 = ((long)p_Var16 >> 7) + 1;
                    lVar21 = 0;
                    local_38 = p_Var16;
                    do {
                      lVar15 = lVar21;
                      lVar21 = std::__cxx11::string::find
                                         ((char *)&local_1e8,
                                          *(ulong *)((long)puVar19 + lVar15 + -0x20),0);
                      if (lVar21 != -1) {
                        puVar18 = (ulong *)((long)puVar19 + lVar15);
                        uVar22 = local_2a0;
                        goto LAB_00142166;
                      }
                      lVar21 = std::__cxx11::string::find
                                         ((char *)&local_1e8,
                                          *(ulong *)((long)puVar19 + lVar15 + -0x40),0);
                      if (lVar21 != -1) {
                        puVar18 = (ulong *)((long)puVar19 + lVar15 + -0x20);
                        uVar22 = local_2a0;
                        goto LAB_00142166;
                      }
                      lVar21 = std::__cxx11::string::find
                                         ((char *)&local_1e8,
                                          *(ulong *)((long)puVar19 + lVar15 + -0x60),0);
                      if (lVar21 != -1) {
                        puVar18 = (ulong *)((long)puVar19 + lVar15 + -0x40);
                        uVar22 = local_2a0;
                        goto LAB_00142166;
                      }
                      lVar21 = std::__cxx11::string::find
                                         ((char *)&local_1e8,
                                          *(ulong *)((long)puVar19 + lVar15 + -0x80),0);
                      uVar22 = local_2a0;
                      if (lVar21 != -1) {
                        puVar18 = (ulong *)((long)puVar19 + lVar15 + -0x60);
                        goto LAB_00142166;
                      }
                      lVar24 = lVar24 + -1;
                      lVar21 = lVar15 + -0x80;
                    } while (1 < lVar24);
                    p_Var16 = (_Base_ptr)((long)&local_38[-4]._M_color + lVar15);
                    puVar19 = (ulong *)((long)puVar19 + lVar15 + -0x80);
                    puVar25 = local_298;
                  }
                  lVar21 = (long)p_Var16 >> 5;
                  if (lVar21 == 1) {
LAB_00142121:
                    lVar21 = std::__cxx11::string::find((char *)&local_1e8,puVar19[-4],0);
                    puVar18 = puVar25;
                    if (lVar21 != -1) {
                      puVar18 = puVar19;
                    }
                  }
                  else if (lVar21 == 2) {
LAB_001420fd:
                    lVar21 = std::__cxx11::string::find((char *)&local_1e8,puVar19[-4],0);
                    puVar18 = puVar19;
                    if (lVar21 == -1) {
                      puVar19 = puVar19 + -4;
                      goto LAB_00142121;
                    }
                  }
                  else {
                    puVar18 = puVar25;
                    if ((lVar21 == 3) &&
                       (lVar21 = std::__cxx11::string::find((char *)&local_1e8,puVar19[-4],0),
                       puVar18 = puVar19, lVar21 == -1)) {
                      puVar19 = puVar19 + -4;
                      goto LAB_001420fd;
                    }
                  }
LAB_00142166:
                  lVar21 = (long)puVar18 -
                           (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                                 whitelist_abi_cxx11_ >> 5;
                  if (lVar21 < 1) {
                    lVar21 = 0;
                  }
                }
                if (local_1e8 != local_1d8) {
                  operator_delete(local_1e8);
                }
                if ((int)lVar21 <= (int)local_280) goto LAB_00141f19;
                std::__cxx11::string::_M_assign((string *)local_290);
                iVar6 = (int)lVar21;
              }
              else {
LAB_00141f19:
                uVar22 = local_2b0 & 0xffffffff;
                iVar6 = (int)local_280;
              }
              local_2b0 = uVar22 & 0xffffffff;
              local_280 = (char *)CONCAT44(local_280._4_4_,iVar6);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1c8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_198);
          local_218 = local_218 + 1;
        } while ((local_218 <
                  (ulong)((long)local_278.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_278.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
                (local_290->_M_string_length == 0));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
    }
  }
  if ((char)local_284 != '\0') {
    if (local_290->_M_string_length == 0) {
      poVar10 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No texture image found",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Using texture image: ",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(local_290->_M_dataplus)._M_p,
                           local_290->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    }
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return (int)local_2b0;
}

Assistant:

int getViewImageName(std::string &image, const char *name, const char *spath,
                     bool verbose)
{
  int rating=-1;
  int ret=0;

  // get image name from specification

  std::vector<std::string> list;

  gutil::split(list, name, ',');

  image.clear();

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "i=") == 0)
    {
      image=list[i].substr(2);
      ret=1;
    }
  }

  // support format of Middlebury stereo benchmark data sets

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      long dw, dh;
      int  dd;

      getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);

      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, depthname.substr(0, pos)+"im"+depthname[pos+4]+".", "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // try to load image header and compare size to depth image

        try
        {
          long w, h;
          int  d;

          getImageIO().loadHeader(s.c_str(), w, h, d);

          int ds=(w+dw-1)/dw;
          if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
          {
            if (verbose)
            {
              std::cout << "Found suitable image: " << s << std::endl;
            }

            if (dd == 1)
            {
              image=s;
              dd=d;
              ret=ds;
            }
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }
  }

  // alternatively, search for image name

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    bool tiled=false;

    size_t pos=depthname.rfind(':');

    if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
    {
      tiled=true;
    }

    long dw, dh;
    int  dd;

    getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);
    dd=0;

    // go through list of prefixes

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (size_t i=0; i<list.size() && image.size() == 0; i++)
    {
      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, list[i], "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image and prefer color images

      std::set<std::string> checked;
      checked.insert(depthname);

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // if the depth image is a tiled image, then try to detect the
        // corresponding image as tiled

        if (tiled)
        {
          size_t pos=s.find_last_of("/\\");

          if (pos == s.npos)
          {
            pos=0;
          }

          pos=s.find('_', pos);

          if (pos != s.npos)
          {
            size_t pos2=s.rfind('_');

            if (pos2 > pos)
            {
              s=s.substr(0, pos)+":"+s.substr(pos2+1);
            }
          }
        }

        // try to load image header and compare size to depth image

        if (checked.find(s) == checked.end() &&
            s.compare(s.size()-4, 4, ".txt") != 0 &&
            s.compare(s.size()-4, 4, ".TXT") != 0)
        {
          checked.insert(s);

          try
          {
            long w, h;
            int  d;

            getImageIO().loadHeader(s.c_str(), w, h, d);

            int ds=(w+dw-1)/dw;
            if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
            {
              if (verbose)
              {
                std::cout << "Found suitable image: " << s << std::endl;
              }

              int r=getTextureNameRating(s.substr(list[i].size()));
              if (r > rating)
              {
                image=s;
                rating=r;
                ret=ds;
              }
            }
          }
          catch (const gutil::Exception &)
          { }
        }
      }
    }
  }

  if (verbose)
  {
    if (image.size() > 0)
    {
      std::cout << "Using texture image: " << image << std::endl;
    }
    else
    {
      std::cout << "No texture image found" << std::endl;
    }
  }

  return ret;
}